

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t)>
               (interval_t *adata,timestamp_t *bdata,timestamp_t *cdata,timestamp_t *result_data,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_timestamp_t_interval_t_timestamp_t_timestamp_t *fun)

{
  ulong *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  unsigned_long *puVar4;
  undefined4 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  timestamp_t tVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  interval_t iVar16;
  interval_t iVar17;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  timestamp_t *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar15 = 0;
      do {
        uVar10 = uVar15;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)asel->sel_vector[uVar15];
        }
        uVar13 = uVar15;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)bsel->sel_vector[uVar15];
        }
        uVar14 = uVar15;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)csel->sel_vector[uVar15];
        }
        uVar2 = adata[uVar10].months;
        uVar5 = adata[uVar10].days;
        iVar16.days = uVar5;
        iVar16.months = uVar2;
        iVar16.micros = adata[uVar10].micros;
        tVar11 = (*fun)(iVar16,bdata[uVar13].value,cdata[uVar14].value);
        result_data[uVar15].value = tVar11.value;
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else if (count != 0) {
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar15 = 0;
    local_40 = bdata;
    do {
      uVar10 = uVar15;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)asel->sel_vector[uVar15];
      }
      uVar13 = uVar15;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)bsel->sel_vector[uVar15];
      }
      uVar14 = uVar15;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar14 = (ulong)csel->sel_vector[uVar15];
      }
      puVar4 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
          && ((puVar4 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0))
             )) && ((puVar4 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar4 == (unsigned_long *)0x0 ||
                    ((puVar4[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))) {
        uVar3 = adata[uVar10].months;
        uVar6 = adata[uVar10].days;
        iVar17.days = uVar6;
        iVar17.months = uVar3;
        iVar17.micros = adata[uVar10].micros;
        tVar11 = (*fun)(iVar17,bdata[uVar13].value,cdata[uVar14].value);
        result_data[uVar15].value = tVar11.value;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var9 = p_Stack_50;
          peVar8 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar8;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          bdata = local_40;
        }
        bVar7 = (byte)uVar15 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}